

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::my_merge_quads_to_grids(SceneGraph *this,Ref<embree::SceneGraph::Node> *node)

{
  uint uVar1;
  Vec3fa *pVVar2;
  undefined8 *puVar3;
  float *pfVar4;
  undefined8 *puVar5;
  Node *pNVar6;
  long *plVar7;
  pointer pvVar8;
  void *ptr;
  undefined8 uVar9;
  RTCGeometry pRVar10;
  GridMeshNode *pGVar11;
  bool bVar12;
  bool bVar13;
  size_t i_1;
  long *plVar14;
  size_type sVar15;
  long lVar16;
  Vec3fa *pVVar17;
  void *pvVar18;
  long lVar19;
  size_t i_3;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  size_t i;
  long lVar23;
  int iVar24;
  size_t i_2;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  reference rVar33;
  uint edge;
  RTCGeometry local_270;
  GridMeshNode *local_268;
  Node *local_260;
  Vec3fa *local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  long *local_238;
  Ref<embree::SceneGraph::MaterialNode> local_230;
  Ref<embree::SceneGraph::Node> local_228;
  Ref<embree::SceneGraph::Node> local_220;
  Ref<embree::SceneGraph::Node> local_218;
  vector<bool,_std::allocator<bool>_> visited;
  avector<Vec3fa> local_1e8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *local_1b0;
  size_t local_1a8;
  ulong local_1a0;
  ulong local_198;
  long local_190;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faces;
  deque<unsigned_int,_std::allocator<unsigned_int>_> left;
  deque<unsigned_int,_std::allocator<unsigned_int>_> bottom;
  deque<unsigned_int,_std::allocator<unsigned_int>_> top;
  deque<unsigned_int,_std::allocator<unsigned_int>_> right;
  
  pNVar6 = node->ptr;
  if (pNVar6 != (Node *)0x0) {
    local_260 = (Node *)this;
    plVar14 = (long *)__dynamic_cast(pNVar6,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar14 == (long *)0x0) {
      plVar14 = (long *)__dynamic_cast(pNVar6,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar14 == (long *)0x0) {
        plVar14 = (long *)__dynamic_cast(pNVar6,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar14 == (long *)0x0) {
          plVar14 = (long *)__dynamic_cast(pNVar6,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          this = (SceneGraph *)local_260;
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 0x10))(plVar14);
            local_238 = plVar14;
            local_268 = (GridMeshNode *)::operator_new(0xa8);
            local_230.ptr = (MaterialNode *)plVar14[0x1a];
            if (local_230.ptr != (MaterialNode *)0x0) {
              (*((local_230.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            pGVar11 = local_268;
            GridMeshNode::GridMeshNode
                      (local_268,&local_230,*(BBox1f *)(plVar14 + 0xd),
                       plVar14[0xf] - plVar14[0xe] >> 5);
            (*(pGVar11->super_Node).super_RefCount._vptr_RefCount[2])(pGVar11);
            if (local_230.ptr != (MaterialNode *)0x0) {
              (*((local_230.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
            sVar15 = (**(code **)(*plVar14 + 0x70))(plVar14);
            std::vector<bool,_std::allocator<bool>_>::resize(&visited,sVar15,false);
            for (uVar25 = 0;
                uVar25 < (ulong)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset +
                         ((long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
                uVar25 = uVar25 + 1) {
              rVar33 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,uVar25);
              *rVar33._M_p = *rVar33._M_p & ~rVar33._M_mask;
            }
            sVar15 = (**(code **)(*plVar14 + 0x70))(plVar14);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&faces,sVar15,(allocator_type *)&left);
            for (uVar25 = 0;
                uVar25 < (ulong)((long)faces.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)faces.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar25 = uVar25 + 1) {
              faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar25] = 4;
            }
            local_270 = (RTCGeometry)rtcNewGeometry(g_device,8);
            (**(code **)(*plVar14 + 0x70))(plVar14);
            rtcSetSharedGeometryBuffer
                      (local_270,0x10,0,0x5001,
                       faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start,0,4);
            lVar23 = plVar14[0x17];
            lVar16 = (**(code **)(*plVar14 + 0x70))(plVar14);
            rtcSetSharedGeometryBuffer(local_270,0,0,0x5001,lVar23,0,4,lVar16 << 2);
            rtcSetSharedGeometryBuffer
                      (local_270,1,0,0x9003,*(undefined8 *)(plVar14[0xe] + 0x18),0,0x10);
            rtcCommitGeometry(local_270);
            local_1b0 = &local_268->grids;
            local_250 = 0;
            do {
              uVar25 = (**(code **)(*plVar14 + 0x70))(plVar14);
              uVar21 = local_250 & 0xffffffff;
              if (uVar25 <= uVar21) {
                rtcReleaseGeometry(local_270);
                (local_260->super_RefCount)._vptr_RefCount = (_func_int **)local_268;
                (*(local_268->super_Node).super_RefCount._vptr_RefCount[2])();
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&faces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                          (&visited.super__Bvector_base<std::allocator<bool>_>);
                (*(local_268->super_Node).super_RefCount._vptr_RefCount[3])();
                (**(code **)(*plVar14 + 0x18))(plVar14);
                return (Ref<embree::SceneGraph::Node>)local_260;
              }
              local_250 = uVar21;
              rVar33 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,uVar21);
              uVar25 = local_250;
              if ((*rVar33._M_p & rVar33._M_mask) == 0) {
                rVar33 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,local_250);
                pRVar10 = local_270;
                *rVar33._M_p = *rVar33._M_p | rVar33._M_mask;
                edge = rtcGetGeometryFirstHalfEdge(local_270,uVar25 & 0xffffffff);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base
                          (&left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base
                          (&right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base
                          (&top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_Deque_base
                          (&bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>,
                           &edge);
                edge = rtcGetGeometryNextHalfEdge(pRVar10,edge);
                std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&bottom,&edge);
                edge = rtcGetGeometryNextHalfEdge(pRVar10,edge);
                std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>,
                           &edge);
                edge = rtcGetGeometryNextHalfEdge(pRVar10,edge);
                std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>,&edge
                          );
                edge = rtcGetGeometryNextHalfEdge(pRVar10,edge);
                uVar25 = 1;
                uVar28 = 1;
                do {
                  pRVar10 = local_270;
                  bVar12 = extend_grid(local_270,&visited,&left,&top,&right);
                  local_240 = CONCAT71(local_240._1_7_,bVar12);
                  bVar12 = extend_grid(pRVar10,&visited,&top,&right,&bottom);
                  local_1c8 = (float)CONCAT31(local_1c8._1_3_,bVar12);
                  bVar12 = extend_grid(pRVar10,&visited,&right,&bottom,&left);
                  bVar13 = extend_grid(pRVar10,&visited,&bottom,&left,&top);
                  iVar24 = (int)uVar25 + ((uint)local_1c8 & 0xff);
                  uVar1 = iVar24 + (uint)bVar13;
                  uVar25 = (ulong)uVar1;
                  iVar22 = uVar28 + (byte)local_240;
                  uVar28 = iVar22 + (uint)bVar12;
                  if (((byte)((bVar12 || bVar13) | (byte)local_240 | local_1c8._0_1_) != 1) ||
                     (0x7fff < (uint)bVar13 + iVar24 + 2)) break;
                } while ((uint)bVar12 + iVar22 + 2 < 0x8000);
                local_1e8._0_4_ =
                     *(undefined4 *)
                      &((local_268->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->size_active;
                iVar22 = uVar1 + 1;
                local_1e8.size_active._0_4_ = CONCAT22((short)(uVar28 + 1),(short)iVar22);
                local_1e8._4_4_ = iVar22;
                std::
                vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                ::emplace_back<embree::SceneGraph::GridMeshNode::Grid>(local_1b0,(Grid *)&local_1e8)
                ;
                uVar20 = (ulong)(iVar22 * (uVar28 + 1));
                local_1a8 = uVar20 << 4;
                local_1a0 = (ulong)uVar28;
                uVar21 = 0;
                plVar14 = local_238;
                local_240 = uVar20;
                local_198 = uVar25;
                while( true ) {
                  lVar23 = plVar14[0xe];
                  local_248 = uVar21;
                  if ((ulong)(plVar14[0xf] - lVar23 >> 5) <= uVar21) break;
                  local_1e8.items = (Vec3fa *)0x0;
                  local_1e8.size_active = 0;
                  local_1e8.size_alloced = 0;
                  if (uVar20 == 0) {
                    local_258 = (Vec3fa *)0x0;
                  }
                  else {
                    local_258 = (Vec3fa *)0x0;
                    pVVar17 = (Vec3fa *)alignedMalloc(local_1a8,0x10);
                    uVar21 = local_248;
                    local_258 = pVVar17;
                    local_1e8.items = pVVar17;
                    alignedFree((void *)0x0);
                    lVar23 = plVar14[0xe];
                    local_258 = pVVar17;
                    local_1e8.size_alloced = uVar20;
                  }
                  lVar16 = uVar21 * 0x20;
                  local_1e8.size_active = uVar20;
                  gather_grid(local_270,&local_1e8,local_198,local_1a0,(uint *)plVar14[0x17],
                              (avector<Vec3fa> *)(lVar23 + lVar16),
                              *left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur);
                  pVVar17 = local_258;
                  local_190 = lVar16;
                  for (uVar25 = 0; uVar25 != uVar20; uVar25 = uVar25 + 1) {
                    pvVar8 = (local_268->positions).
                             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pVVar2 = pVVar17 + uVar25;
                    fVar29 = (pVVar2->field_0).m128[0];
                    fVar30 = (pVVar2->field_0).m128[1];
                    fVar31 = (pVVar2->field_0).m128[2];
                    fVar32 = (pVVar2->field_0).m128[3];
                    lVar23 = *(long *)((long)&pvVar8->size_active + lVar16);
                    uVar20 = *(ulong *)((long)&pvVar8->size_alloced + lVar16);
                    uVar21 = lVar23 + 1;
                    lVar19 = lVar16;
                    if (uVar20 < uVar21) {
                      uVar26 = uVar20;
                      uVar27 = uVar21;
                      if (uVar20 != 0) {
                        for (; uVar27 = uVar26, uVar26 < uVar21;
                            uVar26 = uVar26 * 2 + (ulong)(uVar26 * 2 == 0)) {
                        }
                      }
                      if (uVar20 != uVar27) {
                        ptr = *(void **)((long)&pvVar8->items + lVar16);
                        local_1c8 = fVar29;
                        fStack_1c4 = fVar30;
                        fStack_1c0 = fVar31;
                        fStack_1bc = fVar32;
                        pvVar18 = alignedMalloc(uVar27 << 4,0x10);
                        *(void **)((long)&pvVar8->items + lVar16) = pvVar18;
                        lVar19 = 0;
                        for (uVar20 = 0; uVar20 < *(ulong *)((long)&pvVar8->size_active + lVar16);
                            uVar20 = uVar20 + 1) {
                          puVar5 = (undefined8 *)((long)ptr + lVar19);
                          uVar9 = puVar5[1];
                          puVar3 = (undefined8 *)(*(long *)((long)&pvVar8->items + lVar16) + lVar19)
                          ;
                          *puVar3 = *puVar5;
                          puVar3[1] = uVar9;
                          lVar19 = lVar19 + 0x10;
                        }
                        alignedFree(ptr);
                        *(long *)((long)&pvVar8->size_active + lVar16) = lVar23;
                        *(ulong *)((long)&pvVar8->size_alloced + lVar16) = uVar27;
                        lVar19 = local_190;
                        pVVar17 = local_258;
                        fVar29 = local_1c8;
                        fVar30 = fStack_1c4;
                        fVar31 = fStack_1c0;
                        fVar32 = fStack_1bc;
                      }
                    }
                    *(ulong *)((long)&pvVar8->size_active + lVar16) = uVar21;
                    pfVar4 = (float *)(*(long *)((long)&pvVar8->items + lVar16) + lVar23 * 0x10);
                    *pfVar4 = fVar29;
                    pfVar4[1] = fVar30;
                    pfVar4[2] = fVar31;
                    pfVar4[3] = fVar32;
                    lVar16 = lVar19;
                    uVar20 = local_240;
                    plVar14 = local_238;
                  }
                  alignedFree(pVVar17);
                  uVar21 = local_248 + 1;
                }
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&bottom.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&top.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&right.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                          (&left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>);
              }
              local_250 = (ulong)((int)local_250 + 1);
            } while( true );
          }
        }
        else {
          (**(code **)(*plVar14 + 0x10))(plVar14);
          for (uVar25 = 0; uVar25 < (ulong)(plVar14[0xe] - plVar14[0xd] >> 3); uVar25 = uVar25 + 1)
          {
            local_228.ptr = *(Node **)(plVar14[0xd] + uVar25 * 8);
            if (local_228.ptr != (Node *)0x0) {
              (*((local_228.ptr)->super_RefCount)._vptr_RefCount[2])();
            }
            my_merge_quads_to_grids((SceneGraph *)&left,&local_228);
            lVar23 = plVar14[0xd];
            plVar7 = *(long **)(lVar23 + uVar25 * 8);
            if (plVar7 != (long *)0x0) {
              (**(code **)(*plVar7 + 0x18))();
            }
            *(_Map_pointer *)(lVar23 + uVar25 * 8) =
                 left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_map;
            if (local_228.ptr != (Node *)0x0) {
              (*((local_228.ptr)->super_RefCount)._vptr_RefCount[3])();
            }
          }
          (**(code **)(*plVar14 + 0x18))(plVar14);
          this = (SceneGraph *)local_260;
        }
      }
      else {
        (**(code **)(*plVar14 + 0x10))(plVar14);
        local_220.ptr = (Node *)plVar14[0x10];
        if (local_220.ptr != (Node *)0x0) {
          (*((local_220.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        my_merge_quads_to_grids((SceneGraph *)&left,&local_220);
        if ((long *)plVar14[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar14[0x10] + 0x18))();
        }
        plVar14[0x10] =
             (long)left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_map;
        if (local_220.ptr != (Node *)0x0) {
          (*((local_220.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar14 + 0x18))(plVar14);
        this = (SceneGraph *)local_260;
      }
    }
    else {
      (**(code **)(*plVar14 + 0x10))(plVar14);
      local_218.ptr = (Node *)plVar14[0x13];
      if (local_218.ptr != (Node *)0x0) {
        (*((local_218.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      my_merge_quads_to_grids((SceneGraph *)&left,&local_218);
      if ((long *)plVar14[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar14[0x13] + 0x18))();
      }
      plVar14[0x13] =
           (long)left.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_map;
      if (local_218.ptr != (Node *)0x0) {
        (*((local_218.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar14 + 0x18))(plVar14);
      this = (SceneGraph *)local_260;
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::my_merge_quads_to_grids(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = my_merge_quads_to_grids(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = my_merge_quads_to_grids(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,qmesh->numTimeSteps());
      
      std::vector<bool> visited;
      visited.resize(qmesh->numPrimitives());
      for (size_t i=0; i<visited.size(); i++) visited[i] = false;
      std::vector<unsigned int> faces(qmesh->numPrimitives());
      for (size_t i=0; i<faces.size(); i++) faces[i] = 4;

      /* create temporary subdiv mesh to get access to mesh topology */
      RTCGeometry geom = rtcNewGeometry(g_device,RTC_GEOMETRY_TYPE_SUBDIVISION);
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_FACE,   0, RTC_FORMAT_UINT,   faces.data(), 0, sizeof(unsigned int), qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX,  0, RTC_FORMAT_UINT,   qmesh->quads.data(), 0, sizeof(unsigned int), 4*qmesh->numPrimitives());
      rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, qmesh->positions[0].data(), 0, sizeof(Vec3fa), qmesh->numVertices());
      rtcCommitGeometry(geom);

      /* iterate over mesh and collect all grids */
      for (unsigned int i=0; i<qmesh->numPrimitives(); i++)
      {
        /* skip face if already added to some grid */
        if (visited[i]) continue;
        visited[i] = true;

        /* initialize grid with start quad */
        unsigned int edge = rtcGetGeometryFirstHalfEdge(geom,i);
        std::deque<unsigned int> left, right, top, bottom;
        left.push_back(edge);   edge = rtcGetGeometryNextHalfEdge(geom,edge);
        bottom.push_back(edge); edge = rtcGetGeometryNextHalfEdge(geom,edge);
        right.push_back(edge);  edge = rtcGetGeometryNextHalfEdge(geom,edge);
        top.push_back(edge);    edge = rtcGetGeometryNextHalfEdge(geom,edge);
        assert(edge == rtcGetGeometryFirstHalfEdge(geom,i));
        
        /* extend grid unless no longer possible */
        unsigned int width = 1;
        unsigned int height = 1;
        while (true)
        {
          const bool extended_top    = extend_grid(geom,visited,left,top,right);
          const bool extended_right  = extend_grid(geom,visited,top,right,bottom);
          const bool extended_bottom = extend_grid(geom,visited,right,bottom,left);
          const bool extended_left   = extend_grid(geom,visited,bottom,left,top);
          width  += extended_left + extended_right;
          height += extended_top  + extended_bottom;
          if (!extended_top && !extended_right && !extended_bottom && !extended_left) break;
          if (width+2  > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
          if (height+2 > SceneGraph::GridMeshNode::GRID_RES_MAX) break;
        }
        
        /* add new grid to grid mesh */
        unsigned int startVertex = (unsigned int) gmesh->positions[0].size();
        gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVertex,width+1,width+1,height+1));

        /* gather all vertices of grid */
        for (size_t t=0; t<qmesh->numTimeSteps(); t++)
        {
          avector<Vec3fa> positions;
          positions.resize((width+1)*(height+1));
          gather_grid(geom,positions,width,height,(unsigned int*)qmesh->quads.data(), qmesh->positions[t], left.front());
          for (size_t i=0; i<positions.size(); i++)
            gmesh->positions[t].push_back(positions[i]);
        }
      }

      rtcReleaseGeometry(geom);

      return gmesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }